

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O1

void __thiscall
rsg::ConditionalStatement::execute(ConditionalStatement *this,ExecutionContext *execCtx)

{
  int iVar1;
  int i;
  long lVar2;
  void *__src;
  ExecConstValueAccess value;
  ExecConstValueAccess value_00;
  ExecMaskStorage tmp;
  ExecMaskStorage maskStorage;
  ExecMaskStorage EStack_228;
  ExecMaskStorage local_128;
  
  (*this->m_condition->_vptr_Expression[4])();
  ExecMaskStorage::ExecMaskStorage(&local_128,true);
  value = (ExecConstValueAccess)ExecMaskStorage::getValue(&local_128);
  (*this->m_condition->_vptr_Expression[5])();
  iVar1 = VariableType::getScalarSize(value.m_type);
  if ((iVar1 != 0) && (iVar1 << 6 != 0)) {
    memmove(value.m_value,__src,(long)(iVar1 << 6) << 2);
  }
  ExecutionContext::andExecutionMask(execCtx,value);
  (*this->m_trueStatement->_vptr_Statement[4])(this->m_trueStatement,execCtx);
  ExecutionContext::popExecutionMask(execCtx);
  if (this->m_falseStatement != (Statement *)0x0) {
    ExecMaskStorage::ExecMaskStorage(&EStack_228,true);
    value_00 = (ExecConstValueAccess)ExecMaskStorage::getValue(&EStack_228);
    lVar2 = 0;
    do {
      value_00.m_value[lVar2].boolVal = (bool)(value.m_value[lVar2].boolVal ^ 1);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    ExecutionContext::andExecutionMask(execCtx,value_00);
    (*this->m_falseStatement->_vptr_Statement[4])(this->m_falseStatement,execCtx);
    ExecutionContext::popExecutionMask(execCtx);
  }
  return;
}

Assistant:

void ConditionalStatement::execute (ExecutionContext& execCtx) const
{
	// Evaluate condition
	m_condition->evaluate(execCtx);

	ExecMaskStorage	maskStorage; // Value might change when we are evaluating true block so we have to take a copy.
	ExecValueAccess	trueMask	= maskStorage.getValue();

	trueMask = m_condition->getValue().value();

	// And mask, execute true statement and pop
	execCtx.andExecutionMask(trueMask);
	m_trueStatement->execute(execCtx);
	execCtx.popExecutionMask();

	if (m_falseStatement)
	{
		// Construct negated mask, execute false statement and pop
		ExecMaskStorage tmp;
		ExecValueAccess	falseMask = tmp.getValue();

		for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			falseMask.asBool(i) = !trueMask.asBool(i);

		execCtx.andExecutionMask(falseMask);
		m_falseStatement->execute(execCtx);
		execCtx.popExecutionMask();
	}
}